

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O3

void Acb_NtkPushLogic(Acb_Ntk_t *p,int nLutSize,int fVerbose)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  
  lVar3 = (long)(p->vObjType).nSize;
  if (lVar3 < 1) {
    iVar7 = 0;
  }
  else {
    lVar4 = 0;
    iVar7 = 0;
    do {
      iVar7 = iVar7 + (uint)('\x06' < (p->vObjType).pArray[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  Acb_NtkCreateFanout(p);
  uVar1 = (p->vObjType).nSize;
  uVar5 = (ulong)uVar1;
  if (1 < (int)uVar1) {
    lVar3 = 1;
    do {
      lVar4 = (long)(int)uVar5;
      if (lVar4 <= lVar3) goto LAB_0038333c;
      uVar1 = (uint)(byte)(p->vObjType).pArray[lVar3];
      if ((4 < uVar1) || ((0x19U >> (uVar1 & 0x1f) & 1) == 0)) {
        if ((p->vObjFans).nSize <= lVar3) goto LAB_0038337a;
        iVar6 = (p->vObjFans).pArray[lVar3];
        if (((long)iVar6 < 0) || ((p->vFanSto).nSize <= iVar6)) goto LAB_0038335b;
        if ((p->vFanSto).pArray[iVar6] == 0) {
          Acb_ObjRemoveConst(p,(int)lVar3);
          uVar1 = (p->vObjType).nSize;
          uVar5 = (ulong)uVar1;
          lVar4 = (long)(int)uVar1;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < lVar4);
    if (1 < (int)uVar5) {
      lVar3 = 1;
      do {
        lVar4 = (long)(int)uVar5;
        if (lVar4 <= lVar3) {
LAB_0038333c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        uVar1 = (uint)(byte)(p->vObjType).pArray[lVar3];
        if ((4 < uVar1) || ((0x19U >> (uVar1 & 0x1f) & 1) == 0)) {
          if ((p->vObjFans).nSize <= lVar3) {
LAB_0038337a:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar6 = (p->vObjFans).pArray[lVar3];
          if (((long)iVar6 < 0) || ((p->vFanSto).nSize <= iVar6)) {
LAB_0038335b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          if ((p->vFanSto).pArray[iVar6] == 1) {
            Acb_ObjRemoveBufInv(p,(int)lVar3);
            uVar1 = (p->vObjType).nSize;
            uVar5 = (ulong)uVar1;
            lVar4 = (long)(int)uVar1;
          }
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < lVar4);
    }
  }
  uVar1 = (uint)uVar5;
  if (nLutSize < 2) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    iVar6 = 2;
    do {
      if (1 < (int)uVar5) {
        lVar3 = 1;
        do {
          if ((int)uVar5 <= lVar3) goto LAB_0038333c;
          uVar1 = (uint)(byte)(p->vObjType).pArray[lVar3];
          if ((4 < uVar1) || ((0x19U >> (uVar1 & 0x1f) & 1) == 0)) {
            if ((p->vObjFans).nSize <= lVar3) goto LAB_0038337a;
            iVar2 = (p->vObjFans).pArray[lVar3];
            if (((long)iVar2 < 0) || ((p->vFanSto).nSize <= iVar2)) goto LAB_0038335b;
            if ((p->vFanSto).pArray[iVar2] == iVar6) {
              uVar8 = uVar8 - 1;
              do {
                iVar2 = Acb_ObjPushToFanins(p,(int)lVar3,nLutSize);
                uVar8 = uVar8 + 1;
              } while (iVar2 != 0);
              if ((p->vObjFans).nSize <= lVar3) goto LAB_0038337a;
              iVar2 = (p->vObjFans).pArray[lVar3];
              if (((long)iVar2 < 0) || ((p->vFanSto).nSize <= iVar2)) goto LAB_0038335b;
              if ((p->vFanSto).pArray[iVar2] == 1) {
                Acb_ObjRemoveBufInv(p,(int)lVar3);
              }
            }
          }
          lVar3 = lVar3 + 1;
          uVar5 = (ulong)(p->vObjType).nSize;
        } while (lVar3 < (long)uVar5);
      }
      uVar1 = (uint)uVar5;
      bVar9 = iVar6 != nLutSize;
      iVar6 = iVar6 + 1;
    } while (bVar9);
  }
  iVar6 = 0;
  if (0 < (int)uVar1) {
    uVar5 = 0;
    iVar6 = 0;
    do {
      iVar6 = iVar6 + (uint)('\x06' < (p->vObjType).pArray[uVar5]);
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  printf("Saved %d nodes after %d pushes.\n",(ulong)(uint)(iVar7 - iVar6),(ulong)uVar8);
  return;
}

Assistant:

void Acb_NtkPushLogic( Acb_Ntk_t * p, int nLutSize, int fVerbose )
{
    int n = 0, iObj, nNodes = Acb_NtkNodeNum(p), nPushes = 0;
    Acb_NtkCreateFanout( p );  // fanout data structure
    Acb_NtkForEachNodeSupp( p, iObj, 0 )
        Acb_ObjRemoveConst( p, iObj );
    Acb_NtkForEachNodeSupp( p, iObj, 1 )
        Acb_ObjRemoveBufInv( p, iObj );
    for ( n = 2; n <= nLutSize; n++ )
        Acb_NtkForEachNodeSupp( p, iObj, n )
        {
            while ( Acb_ObjPushToFanins(p, iObj, nLutSize) )
                nPushes++;
            if ( Acb_ObjFaninNum(p, iObj) == 1 )
                Acb_ObjRemoveBufInv( p, iObj );
        }
    printf( "Saved %d nodes after %d pushes.\n", nNodes - Acb_NtkNodeNum(p), nPushes );
}